

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void SubtractionHelper<unsigned_long,_char,_15>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *lhs,char *rhs,char *result)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  
  cVar1 = *rhs;
  uVar3 = (ulong)cVar1;
  if ((long)uVar3 < 0) {
    uVar3 = (ulong)(byte)-cVar1 + *lhs;
    if ((CARRY8((ulong)(byte)-cVar1,*lhs)) || (0x7f < uVar3)) {
LAB_0010cb99:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  else {
    uVar2 = *lhs;
    if (uVar2 < uVar3) {
      uVar3 = (ulong)(byte)((char)uVar2 - cVar1);
    }
    else {
      if (0x7f < uVar2 - uVar3) goto LAB_0010cb99;
      uVar3 = uVar2 - uVar3 & 0xffffffff;
    }
  }
  *result = (char)uVar3;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // U is std::uint64_t, T is signed
        if( rhs < 0 )
        {
            // treat this as addition
            std::uint64_t tmp = 0;

            tmp = lhs + (std::uint64_t)AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( rhs );

            // must check for addition overflow and max
            if( tmp >= lhs && tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }
        else if( (std::uint64_t)rhs > lhs ) // now both are positive, so comparison always works
        {
            // result is negative
            // implies that lhs must fit into T, and result cannot overflow
            // Also allows us to drop to 32-bit math, which is faster on a 32-bit system
            result = (T)lhs - (T)rhs;
            return;
        }
        else
        {
            // result is positive
            std::uint64_t tmp = (std::uint64_t)lhs - (std::uint64_t)rhs;

            if( tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }